

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_movingcamera.cpp
# Opt level: O0

bool __thiscall AMovingCamera::Interpolate(AMovingCamera *this)

{
  bool bVar1;
  AActor *pAVar2;
  AActor *pAVar3;
  TAngle<double> local_88;
  TVector3<double> local_80;
  double dist;
  DVector3 local_50;
  undefined1 local_38 [8];
  DVector3 diff;
  AMovingCamera *this_local;
  
  bVar1 = TObjPtr<AActor>::operator==
                    (&(this->super_APathFollower).super_AActor.tracer,(AActor *)0x0);
  if (bVar1) {
    this_local._7_1_ = APathFollower::Interpolate(&this->super_APathFollower);
  }
  else {
    bVar1 = APathFollower::Interpolate(&this->super_APathFollower);
    if (bVar1) {
      pAVar2 = ::TObjPtr::operator_cast_to_AActor_
                         ((TObjPtr *)&(this->super_APathFollower).super_AActor.tracer);
      AActor::AngleTo((AActor *)&diff.Z,(AActor *)this,SUB81(pAVar2,0));
      TAngle<double>::operator=
                (&(this->super_APathFollower).super_AActor.Angles.Yaw,(TAngle<double> *)&diff.Z);
      if (((this->super_APathFollower).super_AActor.args[2] & 4U) != 0) {
        AActor::Pos(&local_50,(AActor *)this);
        pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APathFollower).super_AActor.tracer);
        pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APathFollower).super_AActor.tracer);
        AActor::PosPlusZ((DVector3 *)&dist,pAVar2,pAVar3->Height / 2.0);
        TVector3<double>::operator-
                  ((TVector3<double> *)local_38,&local_50,(TVector3<double> *)&dist);
        TVector3<double>::XY(&local_80);
        local_80.Z = TVector2<double>::Length((TVector2<double> *)&local_80);
        if ((local_80.Z != 0.0) || (NAN(local_80.Z))) {
          VecToAngle(local_80.Z,diff.Y);
        }
        else {
          TAngle<double>::TAngle(&local_88,0.0);
        }
        TAngle<double>::operator=(&(this->super_APathFollower).super_AActor.Angles.Pitch,&local_88);
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AMovingCamera::Interpolate ()
{
	if (tracer == NULL)
		return Super::Interpolate ();

	if (Super::Interpolate ())
	{
		Angles.Yaw = AngleTo(tracer, true);

		if (args[2] & 4)
		{ // Also aim camera's pitch;
			DVector3 diff = Pos() - tracer->PosPlusZ(tracer->Height / 2);
			double dist = diff.XY().Length();
			Angles.Pitch = dist != 0.f ? VecToAngle(dist, diff.Z) : 0.;
		}

		return true;
	}
	return false;
}